

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::matchSimpleSelector(SimpleSelector *selector,SVGElement *element)

{
  ElementID EVar1;
  ElementID EVar2;
  bool bVar3;
  reference selector_00;
  reference selector_01;
  PseudoClassSelector *sel_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_> *__range1_1;
  AttributeSelector *sel;
  const_iterator __end1;
  const_iterator __begin1;
  vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_> *__range1;
  SVGElement *element_local;
  SimpleSelector *selector_local;
  
  if ((selector->id != Star) &&
     (EVar1 = selector->id, EVar2 = SVGElement::id(element), EVar1 != EVar2)) {
    return false;
  }
  __end1 = std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::
           begin(&selector->attributeSelectors);
  sel = (AttributeSelector *)
        std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>::end
                  (&selector->attributeSelectors);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_lunasvg::AttributeSelector_*,_std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>_>
                                *)&sel);
    if (!bVar3) {
      __end1_1 = std::
                 vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>
                 ::begin(&selector->pseudoClassSelectors);
      sel_1 = (PseudoClassSelector *)
              std::
              vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>::
              end(&selector->pseudoClassSelectors);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end1_1,
                           (__normal_iterator<const_lunasvg::PseudoClassSelector_*,_std::vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>_>
                            *)&sel_1);
        if (!bVar3) {
          return true;
        }
        selector_01 = __gnu_cxx::
                      __normal_iterator<const_lunasvg::PseudoClassSelector_*,_std::vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>_>
                      ::operator*(&__end1_1);
        bVar3 = matchPseudoClassSelector(selector_01,element);
        if (!bVar3) break;
        __gnu_cxx::
        __normal_iterator<const_lunasvg::PseudoClassSelector_*,_std::vector<lunasvg::PseudoClassSelector,_std::allocator<lunasvg::PseudoClassSelector>_>_>
        ::operator++(&__end1_1);
      }
      return false;
    }
    selector_00 = __gnu_cxx::
                  __normal_iterator<const_lunasvg::AttributeSelector_*,_std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>_>
                  ::operator*(&__end1);
    bVar3 = matchAttributeSelector(selector_00,element);
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<const_lunasvg::AttributeSelector_*,_std::vector<lunasvg::AttributeSelector,_std::allocator<lunasvg::AttributeSelector>_>_>
    ::operator++(&__end1);
  }
  return false;
}

Assistant:

static bool matchSimpleSelector(const SimpleSelector& selector, const SVGElement* element)
{
    if(selector.id != ElementID::Star && selector.id != element->id())
        return false;
    for(const auto& sel : selector.attributeSelectors) {
        if(!matchAttributeSelector(sel, element)) {
            return false;
        }
    }

    for(const auto& sel : selector.pseudoClassSelectors) {
        if(!matchPseudoClassSelector(sel, element)) {
            return false;
        }
    }

    return true;
}